

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5DlidxIter * fts5DlidxIterInit(Fts5Index *p,int bRev,int iSegid,int iLeafPg)

{
  undefined8 *puVar1;
  byte bVar2;
  int iVar3;
  Fts5DlidxIter *pFVar4;
  Fts5Data *pFVar5;
  Fts5DlidxIter *pIter;
  sqlite3_uint64 n;
  long iRowid;
  ulong uVar6;
  Fts5DlidxLvl *pFVar7;
  int i;
  long lVar8;
  
  lVar8 = 0;
  bVar2 = 0;
  pIter = (Fts5DlidxIter *)0x0;
LAB_001a4794:
  n = lVar8 * 0x20 + 0x28;
  iRowid = lVar8 * 0x80000000 + (long)iLeafPg + ((ulong)(uint)iSegid << 0x25) + 0x1000000000;
  do {
    lVar8 = lVar8 + 1;
    if (bVar2 != 0 || p->rc != 0) {
      if (p->rc != 0) goto LAB_001a48f4;
      pIter->iSegid = iSegid;
      if (bRev == 0) {
        pFVar7 = pIter->aLvl;
        for (lVar8 = 0; lVar8 < pIter->nLvl; lVar8 = lVar8 + 1) {
          fts5DlidxLvlNext(pFVar7);
          pFVar7 = pFVar7 + 1;
        }
        iVar3 = p->rc;
      }
      else {
        iVar3 = 0;
        uVar6 = (ulong)(uint)pIter->nLvl;
        while ((iVar3 == 0 && (0 < (int)uVar6))) {
          pFVar7 = pIter->aLvl + (uVar6 - 1);
          do {
            iVar3 = fts5DlidxLvlNext(pFVar7);
          } while (iVar3 == 0);
          pFVar7->bEof = 0;
          if (1 < (int)uVar6) {
            sqlite3_free(pFVar7[-1].pData);
            pFVar7[-1].iFirstOff = 0;
            pFVar7[-1].iLeafPgno = 0;
            pFVar7[-1].iRowid = 0;
            pFVar7[-1].pData = (Fts5Data *)0x0;
            pFVar7[-1].iOff = 0;
            pFVar7[-1].bEof = 0;
            pFVar5 = fts5DataRead(p,(long)pFVar7->iLeafPgno + uVar6 * 0x80000000 +
                                    ((ulong)(uint)pIter->iSegid << 0x25) + 0xf00000000);
            pFVar7[-1].pData = pFVar5;
          }
          iVar3 = p->rc;
          uVar6 = uVar6 - 1;
        }
      }
      if (iVar3 != 0) {
LAB_001a48f4:
        fts5DlidxIterFree(pIter);
        pIter = (Fts5DlidxIter *)0x0;
      }
      return pIter;
    }
    pFVar4 = (Fts5DlidxIter *)sqlite3_realloc64(pIter,n);
    if (pFVar4 != (Fts5DlidxIter *)0x0) break;
    p->rc = 7;
    n = n + 0x20;
    iRowid = iRowid + 0x80000000;
    bVar2 = 0;
  } while( true );
  puVar1 = (undefined8 *)((long)pFVar4->aLvl + (n - 0x18));
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)pFVar4->aLvl + (n - 0x28));
  *puVar1 = 0;
  puVar1[1] = 0;
  pFVar5 = fts5DataRead(p,iRowid);
  *(Fts5Data **)((long)pFVar4->aLvl + (n - 0x28)) = pFVar5;
  if (pFVar5 == (Fts5Data *)0x0) {
    bVar2 = 0;
  }
  else {
    bVar2 = ~*pFVar5->p & 1;
  }
  pFVar4->nLvl = (int)lVar8;
  pIter = pFVar4;
  goto LAB_001a4794;
}

Assistant:

static Fts5DlidxIter *fts5DlidxIterInit(
  Fts5Index *p,                   /* Fts5 Backend to iterate within */
  int bRev,                       /* True for ORDER BY ASC */
  int iSegid,                     /* Segment id */
  int iLeafPg                     /* Leaf page number to load dlidx for */
){
  Fts5DlidxIter *pIter = 0;
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    sqlite3_int64 nByte = sizeof(Fts5DlidxIter) + i * sizeof(Fts5DlidxLvl);
    Fts5DlidxIter *pNew;

    pNew = (Fts5DlidxIter*)sqlite3_realloc64(pIter, nByte);
    if( pNew==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      i64 iRowid = FTS5_DLIDX_ROWID(iSegid, i, iLeafPg);
      Fts5DlidxLvl *pLvl = &pNew->aLvl[i];
      pIter = pNew;
      memset(pLvl, 0, sizeof(Fts5DlidxLvl));
      pLvl->pData = fts5DataRead(p, iRowid);
      if( pLvl->pData && (pLvl->pData->p[0] & 0x0001)==0 ){
        bDone = 1;
      }
      pIter->nLvl = i+1;
    }
  }

  if( p->rc==SQLITE_OK ){
    pIter->iSegid = iSegid;
    if( bRev==0 ){
      fts5DlidxIterFirst(pIter);
    }else{
      fts5DlidxIterLast(p, pIter);
    }
  }

  if( p->rc!=SQLITE_OK ){
    fts5DlidxIterFree(pIter);
    pIter = 0;
  }

  return pIter;
}